

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringize.h
# Opt level: O0

DefaultStringizer<bool,true> * __thiscall
snowhouse::detail::DefaultStringizer<bool,true>::ToString_abi_cxx11_
          (DefaultStringizer<bool,true> *this,bool *value)

{
  ostringstream local_190 [8];
  ostringstream buf;
  bool *value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,(bool)(*value & 1));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

static std::string ToString(const T& value)
      {
        std::ostringstream buf;
        buf << value;
        return buf.str();
      }